

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * dup_str(char *s,char *e)

{
  size_t sVar1;
  char *__dest;
  int local_30;
  char *ss;
  int l;
  char *e_local;
  char *s_local;
  
  if (e == (char *)0x0) {
    sVar1 = strlen(s);
    local_30 = (int)sVar1;
  }
  else {
    local_30 = (int)e - (int)s;
  }
  __dest = (char *)malloc((long)(local_30 + 1));
  memcpy(__dest,s,(long)local_30);
  __dest[local_30] = '\0';
  return __dest;
}

Assistant:

char *dup_str(const char *s, const char *e) {
  int l = e ? e - s : strlen(s);
  char *ss = (char *)MALLOC(l + 1);
  memcpy(ss, s, l);
  ss[l] = 0;
  return ss;
}